

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureFormatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Performance::TextureFormatTests::init(TextureFormatTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 format_00;
  Context *context;
  undefined4 magFilter_00;
  undefined4 dataType_00;
  char *pcVar1;
  Texture2DRenderCase *this_00;
  char *description;
  TextureFormatTests *pTVar2;
  Matrix<float,_3,_3> local_108;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string descriptionBase;
  int numTextures;
  deUint32 magFilter;
  deUint32 minFilter;
  deUint32 wrapT;
  deUint32 wrapS;
  allocator<char> local_59;
  string local_58 [8];
  string nameBase;
  deUint32 dataType;
  deUint32 format;
  int formatNdx;
  TextureFormatTests *this_local;
  
  dataType = 0;
  pTVar2 = this;
  while ((int)dataType < 8) {
    format_00 = init::texFormats[(int)dataType].format;
    nameBase.field_2._12_4_ = init::texFormats[(int)dataType].dataType;
    pcVar1 = init::texFormats[(int)dataType].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_58,pcVar1,&local_59);
    std::allocator<char>::~allocator(&local_59);
    descriptionBase.field_2._12_4_ = 0x2600;
    descriptionBase.field_2._8_4_ = 1;
    pcVar1 = glu::getTextureFormatName(format_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,pcVar1,&local_e1);
    std::operator+(&local_c0,&local_e0,", ");
    pcVar1 = glu::getTypeName(nameBase.field_2._12_4_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   &local_c0,pcVar1);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    this_00 = (Texture2DRenderCase *)operator_new(0x220);
    context = (this->super_TestCaseGroup).m_context;
    pcVar1 = (char *)std::__cxx11::string::c_str();
    description = (char *)std::__cxx11::string::c_str();
    dataType_00 = nameBase.field_2._12_4_;
    magFilter_00 = descriptionBase.field_2._12_4_;
    tcu::Matrix<float,_3,_3>::Matrix(&local_108);
    Texture2DRenderCase::Texture2DRenderCase
              (this_00,context,pcVar1,description,format_00,dataType_00,0x812f,0x812f,0x2600,
               magFilter_00,&local_108,descriptionBase.field_2._8_4_,false);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    tcu::Matrix<float,_3,_3>::~Matrix(&local_108);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string(local_58);
    dataType = dataType + 1;
    pTVar2 = (TextureFormatTests *)(ulong)dataType;
  }
  return (int)pTVar2;
}

Assistant:

void TextureFormatTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} texFormats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		deUint32	format			= texFormats[formatNdx].format;
		deUint32	dataType		= texFormats[formatNdx].dataType;
		string		nameBase		= texFormats[formatNdx].name;
		deUint32	wrapS			= GL_CLAMP_TO_EDGE;
		deUint32	wrapT			= GL_CLAMP_TO_EDGE;
		deUint32	minFilter		= GL_NEAREST;
		deUint32	magFilter		= GL_NEAREST;
		int			numTextures		= 1;
		string		descriptionBase	= string(glu::getTextureFormatName(format)) + ", " + glu::getTypeName(dataType);

		addChild(new Texture2DRenderCase(m_context, nameBase.c_str(), descriptionBase.c_str(), format, dataType, wrapS, wrapT, minFilter, magFilter, tcu::Mat3(), numTextures, false /* npot */));
	}
}